

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utility.cc
# Opt level: O2

string * dd::GetCurrentDir_abi_cxx11_(void)

{
  string *in_RDI;
  char buf [1024];
  allocator<char> local_419;
  char local_418 [1032];
  
  GetCurrentDir(local_418,0x400);
  std::__cxx11::string::string<std::allocator<char>>((string *)in_RDI,local_418,&local_419);
  return in_RDI;
}

Assistant:

std::string GetCurrentDir()
	{
		int bufLen = 1024;
		char buf[1024];
		GetCurrentDir(buf, bufLen);
		std::string str = buf;
		return str;
	}